

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O0

vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> * __thiscall
sc_core::sc_vector_base::get_elements(sc_vector_base *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference ppsVar4;
  long lVar5;
  vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *in_RDI;
  sc_object *obj;
  const_iterator it;
  sc_vector_base *in_stack_ffffffffffffffa8;
  __normal_iterator<sc_core::sc_vector_element_*const_*,_std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>_>
  *__lhs;
  value_type *in_stack_ffffffffffffffb8;
  __normal_iterator<sc_core::sc_vector_element_*const_*,_std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>_>
  in_stack_ffffffffffffffd8;
  vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *in_stack_ffffffffffffffe0;
  
  if (in_RDI[5].super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    in_stack_ffffffffffffffb8 = (value_type *)operator_new(0x18);
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::vector
              ((vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)0x2f3f97);
    in_RDI[5].super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffb8;
  }
  sVar2 = std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::size
                    ((vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)
                     in_RDI[5].
                     super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((sVar2 == 0) && (sVar3 = size((sc_vector_base *)0x2f3fea), sVar3 != 0)) {
    __lhs = (__normal_iterator<sc_core::sc_vector_element_*const_*,_std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>_>
             *)in_RDI[5].
               super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    size((sc_vector_base *)0x2f401c);
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::reserve
              (in_stack_ffffffffffffffe0,(size_type)in_stack_ffffffffffffffd8._M_current);
    begin(in_stack_ffffffffffffffa8);
    while( true ) {
      end(in_stack_ffffffffffffffa8);
      bVar1 = __gnu_cxx::operator!=
                        (__lhs,(__normal_iterator<sc_core::sc_vector_element_*const_*,_std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>_>
                                *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      ppsVar4 = __gnu_cxx::
                __normal_iterator<sc_core::sc_vector_element_*const_*,_std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>_>
                ::operator*((__normal_iterator<sc_core::sc_vector_element_*const_*,_std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>_>
                             *)&stack0xffffffffffffffd8);
      lVar5 = (*(code *)(in_RDI->
                        super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[0xf])(in_RDI,*ppsVar4);
      if (lVar5 != 0) {
        std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::push_back
                  (in_RDI,in_stack_ffffffffffffffb8);
      }
      __gnu_cxx::
      __normal_iterator<sc_core::sc_vector_element_*const_*,_std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>_>
      ::operator++((__normal_iterator<sc_core::sc_vector_element_*const_*,_std::vector<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>_>
                    *)&stack0xffffffffffffffd8);
    }
    return (vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)
           in_RDI[5].super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return (vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)
         in_RDI[5].super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

std::vector< sc_object* > const &
sc_vector_base::get_elements() const
{
  if( !objs_vec_ )
    objs_vec_ = new std::vector< sc_object* >;

  if( objs_vec_->size() || !size() )
    return *objs_vec_;

  objs_vec_->reserve( size() );
  for( const_iterator it=begin(); it != end(); ++it )
    if( sc_object* obj = object_cast(*it) )
      objs_vec_->push_back( obj );

  return *objs_vec_;
}